

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * convert_charset_path(char *in_str,Charset from,char *out_str,Charset to)

{
  char16_t *s2;
  int in_ECX;
  char16_t *in_RDX;
  long in_RDI;
  char *temp;
  Charset in_stack_00000020;
  undefined8 local_8;
  
  if ((in_RDX == (char16_t *)0x0) || (in_RDI == 0)) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
    local_8 = (char16_t *)0x0;
  }
  else {
    s2 = (char16_t *)convert_charset(in_str,from,in_stack_00000020);
    if (s2 == (char16_t *)0x0) {
      g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
      local_8 = (char16_t *)0x0;
    }
    else {
      if (in_ECX == 2) {
        strncpyU16(in_RDX,s2,0x103);
      }
      else {
        strncpy((char *)in_RDX,(char *)s2,0x103);
      }
      free(s2);
      local_8 = in_RDX;
    }
  }
  return (char *)local_8;
}

Assistant:

char *convert_charset_path(const char *in_str, Charset from, char *out_str, Charset to)
{
	if (out_str == NULL || in_str == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	char *temp = convert_charset(in_str, from, to);
	if (temp == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	if (to == CS_UTF_16LE)
	{
		strncpyU16((char16_t *)out_str, (char16_t *)temp, MAX_PATH - 1);
	}
	else
	{
		strncpy(out_str, temp, MAX_PATH - 1);
	}
	free(temp);
	return out_str;
}